

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall vm_lookup_ext::copy_ext_from(vm_lookup_ext *this,vm_lookup_ext *old_ext)

{
  uint uVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined8 uVar3;
  long lVar4;
  undefined4 uVar5;
  int iVar6;
  vm_lookup_val **ppvVar7;
  uint uVar8;
  long lVar9;
  vm_lookup_val **ppvVar10;
  vm_lookup_val *pvVar11;
  void *pvVar12;
  bool bVar13;
  
  uVar5 = *(undefined4 *)&(old_ext->default_value).field_0x4;
  aVar2 = (old_ext->default_value).val;
  (this->default_value).typ = (old_ext->default_value).typ;
  *(undefined4 *)&(this->default_value).field_0x4 = uVar5;
  (this->default_value).val = aVar2;
  uVar1 = old_ext->bucket_cnt;
  lVar4 = (ulong)this->bucket_cnt * 8 + 0x20;
  for (lVar9 = 0; uVar1 != (uint)lVar9; lVar9 = lVar9 + 1) {
    pvVar11 = (vm_lookup_val *)
              ((long)this +
              (long)old_ext->buckets[lVar9] + (lVar4 - (long)(old_ext->buckets + uVar1)));
    if (old_ext->buckets[lVar9] == (vm_lookup_val *)0x0) {
      pvVar11 = (vm_lookup_val *)0x0;
    }
    this->buckets[lVar9] = pvVar11;
  }
  uVar8 = old_ext->value_cnt;
  ppvVar10 = old_ext->buckets + old_ext->bucket_cnt;
  ppvVar7 = this[1].buckets + this->bucket_cnt;
  while( true ) {
    bVar13 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar13) break;
    uVar3 = ppvVar10[1];
    *(vm_lookup_val **)&((vm_lookup_val *)(ppvVar7 + -5))->key = *ppvVar10;
    ((vm_lookup_ext *)(ppvVar7 + -4))->bucket_cnt = (int)uVar3;
    ((vm_lookup_ext *)(ppvVar7 + -4))->value_cnt = (int)((ulong)uVar3 >> 0x20);
    uVar3 = ppvVar10[3];
    ppvVar7[-3] = ppvVar10[2];
    *(undefined8 *)(ppvVar7 + -2) = uVar3;
    pvVar12 = (void *)((long)this + ((long)ppvVar10[4] - (long)(old_ext->buckets + uVar1)) + lVar4);
    if (ppvVar10[4] == (vm_lookup_val *)0x0) {
      pvVar12 = (void *)0x0;
    }
    ((anon_union_8_8_cb74652f_for_val *)(ppvVar7 + -1))->ptr = pvVar12;
    ppvVar10 = ppvVar10 + 5;
    ppvVar7 = ppvVar7 + 5;
  }
  this->first_free = (vm_lookup_val *)(ppvVar7 + -5);
  for (iVar6 = old_ext->value_cnt - this->value_cnt; iVar6 != 0; iVar6 = iVar6 + 1) {
    ((anon_union_8_8_cb74652f_for_val *)(ppvVar7 + -1))->ptr = ppvVar7;
    *(undefined4 *)(ppvVar7 + -5) = 0xd;
    *(undefined4 *)(ppvVar7 + -3) = 0xd;
    ppvVar7 = ppvVar7 + 5;
  }
  ppvVar7[-6] = (vm_lookup_val *)0x0;
  return;
}

Assistant:

void vm_lookup_ext::copy_ext_from(vm_lookup_ext *old_ext)
{
    vm_lookup_val **oldbp;
    vm_lookup_val **newbp;
    vm_lookup_val *oldval;
    vm_lookup_val *newval;
    char *oldbase;
    char *newbase;
    uint i;

    /* the bucket counts must be the same in both extensions */
    assert(bucket_cnt == old_ext->bucket_cnt);

    /* we must have at least as many entries as the old one had */
    assert(value_cnt >= old_ext->value_cnt);

    /* copy the default value */
    default_value = old_ext->default_value;

    /* get the new and old base values for faster pointer arithmetic */
    oldbase = (char *)old_ext->idx_to_val(0);
    newbase = (char *)idx_to_val(0);

    /* copy the hash buckets from the old extension to the new extension */
    for (i = old_ext->bucket_cnt, oldbp = old_ext->buckets, newbp = buckets ;
         i != 0 ; --i, ++newbp, ++oldbp)
    {
        /* copy the bucket pointer, adjusting to our local pointer scheme */
        *newbp = (*oldbp == 0
                  ? 0
                  : (vm_lookup_val *)(((char *)*oldbp - oldbase) + newbase));
    }

    /* copy the values from the old extension to the new extension */
    for (i = old_ext->value_cnt, oldval = old_ext->idx_to_val(0),
         newval = idx_to_val(0) ;
         i != 0 ;
         --i, ++oldval, ++newval)
    {
        /* copy this entry */
        newval->key = oldval->key;
        newval->val = oldval->val;
        newval->nxt = (oldval->nxt == 0
                       ? 0
                       : (vm_lookup_val *)(((char *)oldval->nxt - oldbase)
                                           + newbase));
    }

    /* link all of the remaining free values into the free list */
    first_free = newval;
    for (i = value_cnt - old_ext->value_cnt ; i != 0 ; --i, ++newval)
    {
        /* link this value into the free list */
        newval->nxt = newval + 1;

        /* mark this free value as empty */
        newval->key.set_empty();
        newval->val.set_empty();
    }

    /* terminate the free list */
    (newval - 1)->nxt = 0;
}